

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

int amqp_simple_wait_frame_noblock
              (amqp_connection_state_t state,amqp_frame_t *decoded_frame,timeval *timeout)

{
  void *__src;
  timeval *in_RDX;
  amqp_time_t *in_RSI;
  long in_RDI;
  amqp_frame_t *f;
  int res;
  amqp_time_t deadline;
  undefined4 local_4;
  
  local_4 = amqp_time_from_now(in_RSI,in_RDX);
  if (local_4 == 0) {
    if (*(long *)(in_RDI + 0x100) == 0) {
      local_4 = wait_frame_inner((amqp_connection_state_t)decoded_frame,(amqp_frame_t *)timeout,
                                 (amqp_time_t)state);
    }
    else {
      __src = *(void **)(*(long *)(in_RDI + 0x100) + 8);
      *(undefined8 *)(in_RDI + 0x100) = **(undefined8 **)(in_RDI + 0x100);
      if (*(long *)(in_RDI + 0x100) == 0) {
        *(undefined8 *)(in_RDI + 0x108) = 0;
      }
      memcpy(in_RSI,__src,0x30);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int amqp_simple_wait_frame_noblock(amqp_connection_state_t state,
                                   amqp_frame_t *decoded_frame,
                                   const struct timeval *timeout) {
  amqp_time_t deadline;

  int res = amqp_time_from_now(&deadline, timeout);
  if (AMQP_STATUS_OK != res) {
    return res;
  }

  if (state->first_queued_frame != NULL) {
    amqp_frame_t *f = (amqp_frame_t *)state->first_queued_frame->data;
    state->first_queued_frame = state->first_queued_frame->next;
    if (state->first_queued_frame == NULL) {
      state->last_queued_frame = NULL;
    }
    *decoded_frame = *f;
    return AMQP_STATUS_OK;
  } else {
    return wait_frame_inner(state, decoded_frame, deadline);
  }
}